

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db)

{
  Db *pDVar1;
  CollSeq *pCVar2;
  void *p_00;
  Module *pMod_00;
  int iVar3;
  Module *pMod;
  CollSeq *pColl;
  FuncDef *p;
  FuncDef *pNext;
  Db *pDb;
  HashElem *pHStack_18;
  int j;
  HashElem *i;
  sqlite3 *db_local;
  
  if ((db->magic == 0x64cffc7f) && (iVar3 = connectionIsBusy(db), iVar3 == 0)) {
    sqlite3RollbackAll(db,0);
    sqlite3CloseSavepoints(db);
    for (pDb._4_4_ = 0; pDb._4_4_ < db->nDb; pDb._4_4_ = pDb._4_4_ + 1) {
      pDVar1 = db->aDb;
      if (pDVar1[pDb._4_4_].pBt != (Btree *)0x0) {
        sqlite3BtreeClose(pDVar1[pDb._4_4_].pBt);
        pDVar1[pDb._4_4_].pBt = (Btree *)0x0;
        if (pDb._4_4_ != 1) {
          pDVar1[pDb._4_4_].pSchema = (Schema *)0x0;
        }
      }
    }
    if (db->aDb[1].pSchema != (Schema *)0x0) {
      sqlite3SchemaClear(db->aDb[1].pSchema);
    }
    sqlite3VtabUnlockList(db);
    sqlite3CollapseDatabaseArray(db);
    for (pHStack_18 = (db->aFunc).first; pHStack_18 != (HashElem *)0x0;
        pHStack_18 = pHStack_18->next) {
      pColl = (CollSeq *)pHStack_18->data;
      do {
        functionDestroy(db,(FuncDef *)pColl);
        pCVar2 = (CollSeq *)pColl->pUser;
        sqlite3DbFree(db,pColl);
        pColl = pCVar2;
      } while (pCVar2 != (CollSeq *)0x0);
    }
    sqlite3HashClear(&db->aFunc);
    for (pHStack_18 = (db->aCollSeq).first; pHStack_18 != (HashElem *)0x0;
        pHStack_18 = pHStack_18->next) {
      p_00 = pHStack_18->data;
      for (pDb._4_4_ = 0; pDb._4_4_ < 3; pDb._4_4_ = pDb._4_4_ + 1) {
        if (*(long *)((long)p_00 + (long)pDb._4_4_ * 0x28 + 0x20) != 0) {
          (**(code **)((long)p_00 + (long)pDb._4_4_ * 0x28 + 0x20))
                    (*(undefined8 *)((long)p_00 + (long)pDb._4_4_ * 0x28 + 0x10));
        }
      }
      sqlite3DbFree(db,p_00);
    }
    sqlite3HashClear(&db->aCollSeq);
    for (pHStack_18 = (db->aModule).first; pHStack_18 != (HashElem *)0x0;
        pHStack_18 = pHStack_18->next) {
      pMod_00 = (Module *)pHStack_18->data;
      if (pMod_00->xDestroy != (_func_void_void_ptr *)0x0) {
        (*pMod_00->xDestroy)(pMod_00->pAux);
      }
      sqlite3VtabEponymousTableClear(db,pMod_00);
      sqlite3DbFree(db,pMod_00);
    }
    sqlite3HashClear(&db->aModule);
    sqlite3Error(db,0);
    sqlite3ValueFree(db->pErr);
    sqlite3CloseExtensions(db);
    db->magic = 0xb5357930;
    sqlite3DbFree(db,db->aDb[1].pSchema);
    sqlite3_mutex_leave(db->mutex);
    db->magic = 0x9f3c2d33;
    sqlite3_mutex_free(db->mutex);
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    sqlite3_free(db);
  }
  else {
    sqlite3_mutex_leave(db->mutex);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db){
  HashElem *i;                    /* Hash table iterator */
  int j;

  /* If there are outstanding sqlite3_stmt or sqlite3_backup objects
  ** or if the connection has not yet been closed by sqlite3_close_v2(),
  ** then just leave the mutex and return.
  */
  if( db->magic!=SQLITE_MAGIC_ZOMBIE || connectionIsBusy(db) ){
    sqlite3_mutex_leave(db->mutex);
    return;
  }

  /* If we reach this point, it means that the database connection has
  ** closed all sqlite3_stmt and sqlite3_backup objects and has been
  ** passed to sqlite3_close (meaning that it is a zombie).  Therefore,
  ** go ahead and free all resources.
  */

  /* If a transaction is open, roll it back. This also ensures that if
  ** any database schemas have been modified by an uncommitted transaction
  ** they are reset. And that the required b-tree mutex is held to make
  ** the pager rollback and schema reset an atomic operation. */
  sqlite3RollbackAll(db, SQLITE_OK);

  /* Free any outstanding Savepoint structures. */
  sqlite3CloseSavepoints(db);

  /* Close all database connections */
  for(j=0; j<db->nDb; j++){
    struct Db *pDb = &db->aDb[j];
    if( pDb->pBt ){
      sqlite3BtreeClose(pDb->pBt);
      pDb->pBt = 0;
      if( j!=1 ){
        pDb->pSchema = 0;
      }
    }
  }
  /* Clear the TEMP schema separately and last */
  if( db->aDb[1].pSchema ){
    sqlite3SchemaClear(db->aDb[1].pSchema);
  }
  sqlite3VtabUnlockList(db);

  /* Free up the array of auxiliary databases */
  sqlite3CollapseDatabaseArray(db);
  assert( db->nDb<=2 );
  assert( db->aDb==db->aDbStatic );

  /* Tell the code in notify.c that the connection no longer holds any
  ** locks and does not require any further unlock-notify callbacks.
  */
  sqlite3ConnectionClosed(db);

  for(i=sqliteHashFirst(&db->aFunc); i; i=sqliteHashNext(i)){
    FuncDef *pNext, *p;
    p = sqliteHashData(i);
    do{
      functionDestroy(db, p);
      pNext = p->pNext;
      sqlite3DbFree(db, p);
      p = pNext;
    }while( p );
  }
  sqlite3HashClear(&db->aFunc);
  for(i=sqliteHashFirst(&db->aCollSeq); i; i=sqliteHashNext(i)){
    CollSeq *pColl = (CollSeq *)sqliteHashData(i);
    /* Invoke any destructors registered for collation sequence user data. */
    for(j=0; j<3; j++){
      if( pColl[j].xDel ){
        pColl[j].xDel(pColl[j].pUser);
      }
    }
    sqlite3DbFree(db, pColl);
  }
  sqlite3HashClear(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=sqliteHashFirst(&db->aModule); i; i=sqliteHashNext(i)){
    Module *pMod = (Module *)sqliteHashData(i);
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    sqlite3VtabEponymousTableClear(db, pMod);
    sqlite3DbFree(db, pMod);
  }
  sqlite3HashClear(&db->aModule);
#endif

  sqlite3Error(db, SQLITE_OK); /* Deallocates any cached error strings. */
  sqlite3ValueFree(db->pErr);
  sqlite3CloseExtensions(db);
#if SQLITE_USER_AUTHENTICATION
  sqlite3_free(db->auth.zAuthUser);
  sqlite3_free(db->auth.zAuthPW);
#endif

  db->magic = SQLITE_MAGIC_ERROR;

  /* The temp-database schema is allocated differently from the other schema
  ** objects (using sqliteMalloc() directly, instead of sqlite3BtreeSchema()).
  ** So it needs to be freed here. Todo: Why not roll the temp schema into
  ** the same sqliteMalloc() as the one that allocates the database 
  ** structure?
  */
  sqlite3DbFree(db, db->aDb[1].pSchema);
  sqlite3_mutex_leave(db->mutex);
  db->magic = SQLITE_MAGIC_CLOSED;
  sqlite3_mutex_free(db->mutex);
  assert( db->lookaside.nOut==0 );  /* Fails on a lookaside memory leak */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  sqlite3_free(db);
}